

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Creature.cpp
# Opt level: O0

void __thiscall Creature::Creature(Creature *this,Population *pop,size_t chromnom)

{
  Chromosome *this_00;
  double dVar1;
  shared_ptr<Chromosome> local_48;
  ulong local_38;
  size_t i;
  size_t local_20;
  size_t chromnom_local;
  Population *pop_local;
  Creature *this_local;
  
  this->_vptr_Creature = (_func_int **)&PTR__Creature_00147630;
  local_20 = chromnom;
  chromnom_local = (size_t)pop;
  pop_local = (Population *)this;
  std::vector<boost::shared_ptr<Chromosome>,_std::allocator<boost::shared_ptr<Chromosome>_>_>::
  vector(&this->chroms);
  std::pair<double,_double>::pair<double,_double,_true>(&this->domain);
  this->pntpop = (Population *)chromnom_local;
  this->dead = false;
  SERIALCTR = SERIALCTR + 1;
  this->SERIALNO = SERIALCTR;
  for (local_38 = 0; local_38 < local_20; local_38 = local_38 + 1) {
    this_00 = (Chromosome *)operator_new(0x30);
    Chromosome::Chromosome(this_00,1,0x19);
    boost::shared_ptr<Chromosome>::shared_ptr<Chromosome>(&local_48,this_00);
    std::vector<boost::shared_ptr<Chromosome>,_std::allocator<boost::shared_ptr<Chromosome>_>_>::
    push_back(&this->chroms,&local_48);
    boost::shared_ptr<Chromosome>::~shared_ptr(&local_48);
  }
  set_bounds(this,-10.0,10.0);
  dVar1 = make_fitness(this);
  this->fitness = dVar1;
  return;
}

Assistant:

Creature::Creature( Population * pop, size_t chromnom ) :
	pntpop(pop), dead(false), SERIALNO(++Creature::SERIALCTR)
{
	for(size_t i = 0; i < chromnom; ++i)
	{
		chroms.push_back(shared_ptr<Chromosome> (new Chromosome()));
	}

	set_bounds(-10, 10);
	fitness = make_fitness();
}